

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e006::
ARTScanTest_scanRangeForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTScanTest_scanRangeForwardFiveLeavesHaltEarly_Test
          (ARTScanTest_scanRangeForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeForwardFiveLeavesHaltEarly) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  verifier.insert(2, unodb::test::test_values[2]);
  verifier.insert(3, unodb::test::test_values[3]);
  verifier.insert(4, unodb::test::test_values[4]);
  uint64_t n = 0;
  const auto fn =
      [&n](const unodb::visitor<typename TypeParam::iterator>&) noexcept {
        n++;
        return n == 1;  // halt early!
      };
  db.scan_range(1, 3, fn);
  UNODB_EXPECT_EQ(1, n);
}